

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synapse.cxx
# Opt level: O1

void __thiscall SimpleSynapse::prepareNextState(SimpleSynapse *this)

{
  StochasticEventGenerator *pSVar1;
  bool bVar2;
  int iVar3;
  EVP_PKEY_CTX *in_RSI;
  
  pSVar1 = (this->super_Synapse).simplePreNeuron;
  if (pSVar1 != (StochasticEventGenerator *)0x0) {
    iVar3 = (*(pSVar1->super_StochasticVariable).super_StochasticProcess.super_Parametric.
              _vptr_Parametric[0xf])();
    if ((char)iVar3 != '\0') {
      DifferentialEquation::init(&this->differential,in_RSI);
      bVar2 = true;
      goto LAB_00149fc4;
    }
  }
  DifferentialEquation::prepareNextState(&this->differential);
  bVar2 = (this->differential).super_StochasticVariable.super_StochasticProcess.
          stochNextStateIsPrepared;
LAB_00149fc4:
  (this->super_Synapse).super_StochasticFunction.super_StochasticProcess.stochNextStateIsPrepared =
       bVar2;
  return;
}

Assistant:

void SimpleSynapse::prepareNextState()
{
	if( simplePreNeuron && simplePreNeuron->hasEvent() ) {
		differential.init();
		stochNextStateIsPrepared = true;
	} else {
		differential.prepareNextState();
		stochNextStateIsPrepared = differential.isNextStatePrepared();
	}
}